

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

bool duckdb::VectorCastHelpers::TryCastLoop<unsigned_long,unsigned_int,duckdb::NumericTryCast>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  Vector *pVStack_20;
  CastParameters *pCStack_18;
  undefined1 uStack_10;
  
  uStack_10 = 1;
  pVStack_20 = result;
  pCStack_18 = parameters;
  UnaryExecutor::
  GenericExecute<unsigned_long,unsigned_int,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
            (source,result,count,&pVStack_20,parameters->error_message != (string *)0x0);
  return (bool)uStack_10;
}

Assistant:

static bool TryCastLoop(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		return TemplatedTryCastLoop<SRC, DST, VectorTryCastOperator<OP>>(source, result, count, parameters);
	}